

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::EmitScriptFunctionScopeInfo
               (ScriptFunctionScopeInfo *funcScopeInfo,FileWriter *writer,Separator separator)

{
  uint local_20;
  uint32 i;
  Separator separator_local;
  FileWriter *writer_local;
  ScriptFunctionScopeInfo *funcScopeInfo_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteAddr(writer,scopeId,funcScopeInfo->ScopeId,NoSeparator);
  FileWriter::WriteLogTag(writer,ctxTag,funcScopeInfo->ScriptContextLogId,CommaSeparator);
  FileWriter::WriteUInt32(writer,count,(uint)funcScopeInfo->ScopeCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_20 = 0; local_20 < funcScopeInfo->ScopeCount; local_20 = local_20 + 1) {
    (*writer->_vptr_FileWriter[6])
              (writer,(ulong)(local_20 != 0),0,(ulong)CONCAT31((int3)(local_20 >> 8),local_20 != 0))
    ;
    FileWriter::WriteTag<Js::ScopeType>
              (writer,scopeType,funcScopeInfo->ScopeArray[local_20].Tag,NoSeparator);
    FileWriter::WriteAddr
              (writer,subscopeId,funcScopeInfo->ScopeArray[local_20].IDValue,CommaSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitScriptFunctionScopeInfo(const ScriptFunctionScopeInfo* funcScopeInfo, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::scopeId, funcScopeInfo->ScopeId);
            writer->WriteLogTag(NSTokens::Key::ctxTag, funcScopeInfo->ScriptContextLogId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::count, funcScopeInfo->ScopeCount, NSTokens::Separator::CommaSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);

            for(uint32 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);

                writer->WriteTag<Js::ScopeType>(NSTokens::Key::scopeType, funcScopeInfo->ScopeArray[i].Tag);
                writer->WriteAddr(NSTokens::Key::subscopeId, funcScopeInfo->ScopeArray[i].IDValue, NSTokens::Separator::CommaSeparator);

                writer->WriteRecordEnd();
            }

            writer->WriteSequenceEnd();

            writer->WriteRecordEnd();
        }